

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O2

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::performSolutionPolishing
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  Status **ppSVar1;
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *this_00;
  uint n;
  uint n_00;
  int iVar2;
  Status *pSVar3;
  Status *pSVar4;
  bool bVar5;
  bool bVar6;
  Status SVar7;
  int iVar8;
  SPxOut *pSVar9;
  undefined8 *puVar10;
  long lVar11;
  long lVar12;
  Status **ppSVar13;
  long lVar14;
  uint *puVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar17;
  int i_1;
  int iVar18;
  int i;
  ulong uVar19;
  ulong uVar20;
  int i_2;
  ulong uVar21;
  byte bVar22;
  undefined1 local_b01;
  SPxId polishId;
  int local_aec;
  DIdxSet continuousvars;
  Verbosity old_verbosity;
  uint local_ab8;
  int *local_ab0;
  int local_a50;
  bool local_a4c;
  fpclass_type local_a48;
  int32_t iStack_a44;
  Status **local_a40;
  fpclass_type local_a38;
  int32_t iStack_a34;
  undefined8 uStack_a30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_920;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_8a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_820;
  uint local_7a0 [28];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_730;
  cpp_dec_float<200U,_int,_void> local_6b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_630;
  cpp_dec_float<200U,_int,_void> local_5b0;
  cpp_dec_float<200U,_int,_void> local_530;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  origval;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_430;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  cpp_dec_float<200U,_int,_void> local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  cpp_dec_float<200U,_int,_void> local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar22 = 0;
  if (((-1 < this->maxIters) &&
      (this->maxIters <=
       (this->
       super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).iterCount)) && (bVar5 = isTimeLimitReached(this,false), !bVar5)) {
    return false;
  }
  if ((this->polishObj == POLISH_OFF) || (SVar7 = status(this), SVar7 != OPTIMAL)) {
    bVar5 = false;
  }
  else {
    pSVar3 = (this->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thedesc.rowstat.data;
    pSVar4 = (this->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thedesc.colstat.data;
    polishId.super_DataKey.info = 0;
    polishId.super_DataKey.idx = -1;
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x5e])(&origval,this);
    pSVar9 = this->spxout;
    if ((pSVar9 != (SPxOut *)0x0) && (3 < (int)pSVar9->m_verbosity)) {
      continuousvars.super_IdxSet._vptr_IdxSet._0_4_ = 4;
      old_verbosity = pSVar9->m_verbosity;
      (*pSVar9->_vptr_SPxOut[2])();
      pSVar9 = soplex::operator<<(this->spxout," --- perform solution polishing");
      std::endl<char,std::char_traits<char>>(pSVar9->m_streams[pSVar9->m_verbosity]);
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&old_verbosity);
    }
    if (this->theRep == COLUMN) {
      setType(this,ENTER);
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x76])(this);
      entertol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&old_verbosity,this);
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&old_verbosity;
      puVar15 = local_7a0;
      for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
        *puVar15 = (pnVar16->m_backend).data._M_elems[0];
        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
        puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
      }
      local_a38 = local_a48;
      iStack_a34 = iStack_a44;
      uStack_a30 = 0;
      this->instableEnter = false;
      (*this->theratiotester->_vptr_SPxRatioTester[9])
                (this->theratiotester,(ulong)(uint)this->theType);
      local_aec = local_a50;
      local_b01 = local_a4c;
      if (this->polishObj == POLISH_INTEGRALITY) {
        n = (this->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum;
        n_00 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
        DIdxSet::DIdxSet((DIdxSet *)&old_verbosity,n);
        DIdxSet::DIdxSet(&continuousvars,n_00);
        uVar19 = 0;
        if ((int)n < 1) {
          n = 0;
        }
        lVar11 = 0x78;
        for (; n != uVar19; uVar19 = uVar19 + 1) {
          if ((pSVar3[uVar19] | D_ON_UPPER) == P_ON_UPPER) {
            puVar10 = (undefined8 *)
                      ((long)(((this->theCoPvec->
                               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                      + lVar11);
            puVar15 = (uint *)(puVar10 + -0xf);
            pnVar16 = &local_820;
            for (lVar12 = 0x1c; lVar12 != 0; lVar12 = lVar12 + -1) {
              (pnVar16->m_backend).data._M_elems[0] = *puVar15;
              puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
              pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
            }
            local_820.m_backend.exp = *(int *)(puVar10 + -1);
            local_820.m_backend.neg = *(bool *)((long)puVar10 + -4);
            local_820.m_backend._120_8_ = *puVar10;
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
            cpp_dec_float<long_long>(&local_530,0,(type *)0x0);
            epsilon(&local_b0,this);
            bVar5 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_820,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_530,&local_b0);
            if (bVar5) {
              DIdxSet::addIdx((DIdxSet *)&old_verbosity,(int)uVar19);
            }
          }
          lVar11 = lVar11 + 0x80;
        }
        if ((this->integerVariables).thesize == n_00) {
          uVar21 = 0;
          uVar19 = (ulong)n_00;
          if ((int)n_00 < 1) {
            uVar19 = uVar21;
          }
          for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
            if ((pSVar4[uVar20] | D_ON_UPPER) == P_ON_UPPER) {
              result.m_backend.fpclass = cpp_dec_float_finite;
              result.m_backend.prec_elem = 0x1c;
              result.m_backend.data._M_elems[0] = 0;
              result.m_backend.data._M_elems[1] = 0;
              result.m_backend.data._M_elems[2] = 0;
              result.m_backend.data._M_elems[3] = 0;
              result.m_backend.data._M_elems[4] = 0;
              result.m_backend.data._M_elems[5] = 0;
              result.m_backend.data._M_elems[6] = 0;
              result.m_backend.data._M_elems[7] = 0;
              result.m_backend.data._M_elems[8] = 0;
              result.m_backend.data._M_elems[9] = 0;
              result.m_backend.data._M_elems[10] = 0;
              result.m_backend.data._M_elems[0xb] = 0;
              result.m_backend.data._M_elems[0xc] = 0;
              result.m_backend.data._M_elems[0xd] = 0;
              result.m_backend.data._M_elems[0xe] = 0;
              result.m_backend.data._M_elems[0xf] = 0;
              result.m_backend.data._M_elems[0x10] = 0;
              result.m_backend.data._M_elems[0x11] = 0;
              result.m_backend.data._M_elems[0x12] = 0;
              result.m_backend.data._M_elems[0x13] = 0;
              result.m_backend.data._M_elems[0x14] = 0;
              result.m_backend.data._M_elems[0x15] = 0;
              result.m_backend.data._M_elems[0x16] = 0;
              result.m_backend.data._M_elems[0x17] = 0;
              result.m_backend.data._M_elems[0x18] = 0;
              result.m_backend.data._M_elems[0x19] = 0;
              result.m_backend.data._M_elems._104_5_ = 0;
              result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
              result.m_backend.exp = 0;
              result.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                        (&result.m_backend,
                         (cpp_dec_float<200U,_int,_void> *)
                         ((long)(((this->
                                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).
                                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .object.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                _M_elems + uVar21),
                         (cpp_dec_float<200U,_int,_void> *)
                         ((long)(((this->thePvec->
                                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                _M_elems + uVar21));
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_130,0,(type *)0x0);
              epsilon(&local_1b0,this);
              bVar5 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (&result,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                          *)&local_130,&local_1b0);
              if ((bVar5) && ((this->integerVariables).data[uVar20] == 0)) {
                DIdxSet::addIdx(&continuousvars,(int)uVar20);
              }
            }
            uVar21 = uVar21 + 0x80;
          }
        }
        bVar5 = false;
        while (!bVar5) {
          uVar19 = (ulong)local_ab8;
          iVar18 = 0;
          while ((0 < (int)uVar19 && (!bVar5))) {
            polishId = coId(this,local_ab0[uVar19 - 1]);
            bVar6 = enter(this,&polishId,true);
            (*(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x88])(this);
            if (bVar6) {
              iVar18 = iVar18 + 1;
              lVar11 = (long)(int)local_ab8;
              local_ab8 = local_ab8 - 1;
              local_ab0[uVar19 - 1] = local_ab0[lVar11 + -1];
              if ((-1 < this->maxIters) &&
                 (this->maxIters <=
                  (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).iterCount)) {
                bVar5 = true;
              }
            }
            bVar6 = isTimeLimitReached(this,false);
            if (bVar6) {
              bVar5 = true;
            }
            uVar19 = uVar19 - 1;
          }
          uVar19 = (ulong)(uint)continuousvars.super_IdxSet.num;
          while ((0 < (int)uVar19 && (!bVar5))) {
            polishId = id(this,continuousvars.super_IdxSet.idx[uVar19 - 1]);
            bVar6 = enter(this,&polishId,true);
            (*(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x88])(this);
            if (bVar6) {
              iVar18 = iVar18 + 1;
              lVar11 = (long)continuousvars.super_IdxSet.num;
              continuousvars.super_IdxSet.num = continuousvars.super_IdxSet.num + -1;
              continuousvars.super_IdxSet.idx[uVar19 - 1] =
                   continuousvars.super_IdxSet.idx[lVar11 + -1];
              if ((-1 < this->maxIters) &&
                 (this->maxIters <=
                  (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).iterCount)) {
                bVar5 = true;
              }
            }
            bVar6 = isTimeLimitReached(this,false);
            if (bVar6) {
              bVar5 = true;
            }
            uVar19 = uVar19 - 1;
          }
          if (iVar18 == 0) {
            bVar5 = true;
          }
          this->polishCount = this->polishCount + iVar18;
        }
        DIdxSet::~DIdxSet(&continuousvars);
      }
      else {
        DIdxSet::DIdxSet((DIdxSet *)&old_verbosity,(this->thecovectors->set).thenum);
        lVar12 = 0;
        for (lVar11 = 0;
            lVar11 < (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum; lVar11 = lVar11 + 1) {
          if ((pSVar4[lVar11] | D_ON_UPPER) == P_ON_UPPER) {
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 0x1c;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems[6] = 0;
            result_1.m_backend.data._M_elems[7] = 0;
            result_1.m_backend.data._M_elems[8] = 0;
            result_1.m_backend.data._M_elems[9] = 0;
            result_1.m_backend.data._M_elems[10] = 0;
            result_1.m_backend.data._M_elems[0xb] = 0;
            result_1.m_backend.data._M_elems[0xc] = 0;
            result_1.m_backend.data._M_elems[0xd] = 0;
            result_1.m_backend.data._M_elems[0xe] = 0;
            result_1.m_backend.data._M_elems[0xf] = 0;
            result_1.m_backend.data._M_elems[0x10] = 0;
            result_1.m_backend.data._M_elems[0x11] = 0;
            result_1.m_backend.data._M_elems[0x12] = 0;
            result_1.m_backend.data._M_elems[0x13] = 0;
            result_1.m_backend.data._M_elems[0x14] = 0;
            result_1.m_backend.data._M_elems[0x15] = 0;
            result_1.m_backend.data._M_elems[0x16] = 0;
            result_1.m_backend.data._M_elems[0x17] = 0;
            result_1.m_backend.data._M_elems[0x18] = 0;
            result_1.m_backend.data._M_elems[0x19] = 0;
            result_1.m_backend.data._M_elems._104_5_ = 0;
            result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result_1.m_backend,
                       (cpp_dec_float<200U,_int,_void> *)
                       ((long)(((this->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .object.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                       + lVar12),
                       (cpp_dec_float<200U,_int,_void> *)
                       ((long)(((this->thePvec->
                                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                       + lVar12));
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
            cpp_dec_float<long_long>(&local_230,0,(type *)0x0);
            epsilon(&local_2b0,this);
            bVar5 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&result_1,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_230,&local_2b0);
            if (bVar5) {
              DIdxSet::addIdx((DIdxSet *)&old_verbosity,(int)lVar11);
            }
          }
          lVar12 = lVar12 + 0x80;
        }
        bVar5 = false;
        while (!bVar5) {
          uVar19 = (ulong)local_ab8;
          iVar18 = 0;
          while ((0 < (int)uVar19 && (!bVar5))) {
            polishId = id(this,local_ab0[uVar19 - 1]);
            bVar6 = enter(this,&polishId,true);
            (*(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x88])(this);
            if (bVar6) {
              iVar18 = iVar18 + 1;
              lVar11 = (long)(int)local_ab8;
              local_ab8 = local_ab8 - 1;
              local_ab0[uVar19 - 1] = local_ab0[lVar11 + -1];
              if ((-1 < this->maxIters) &&
                 (this->maxIters <=
                  (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).iterCount)) {
                bVar5 = true;
              }
            }
            bVar6 = isTimeLimitReached(this,false);
            if (bVar6) {
              bVar5 = true;
            }
            uVar19 = uVar19 - 1;
          }
          if (iVar18 == 0) {
            bVar5 = true;
          }
          this->polishCount = this->polishCount + iVar18;
        }
      }
    }
    else {
      ppSVar1 = &(this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thedesc.colstat.data;
      setType(this,LEAVE);
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x76])(this);
      leavetol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&old_verbosity,this);
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&old_verbosity;
      puVar15 = local_7a0;
      for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
        *puVar15 = (pnVar16->m_backend).data._M_elems[0];
        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
        puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
      }
      local_aec = local_a50;
      local_b01 = local_a4c;
      local_a38 = local_a48;
      iStack_a34 = iStack_a44;
      uStack_a30 = 0;
      this->instableLeave = false;
      (*this->theratiotester->_vptr_SPxRatioTester[9])
                (this->theratiotester,(ulong)(uint)this->theType);
      iVar18 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      iVar2 = (this->integerVariables).thesize;
      this_00 = &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set;
      if (this->polishObj == POLISH_INTEGRALITY) {
        local_a40 = &(this->
                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).thedesc.rowstat.data;
        DIdxSet::DIdxSet((DIdxSet *)&old_verbosity,(this->thecovectors->set).thenum);
        lVar11 = 0xf;
        for (lVar12 = 0; lVar12 < (this->thecovectors->set).thenum; lVar12 = lVar12 + 1) {
          polishId.super_DataKey =
               (this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).theBaseId.data[lVar12].super_DataKey;
          if (polishId.super_DataKey.info < 0) {
            iVar8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::number(&this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ,&polishId);
            ppSVar13 = local_a40;
LAB_003daf9c:
            if (((*ppSVar13)[iVar8] & (P_ON_LOWER|D_FREE)) == P_ON_LOWER) {
              puVar10 = (undefined8 *)
                        ((((this->theFvec->
                           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                        lVar11 * 2);
              puVar15 = (uint *)(puVar10 + -0xf);
              pnVar16 = &local_8a0;
              for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                (pnVar16->m_backend).data._M_elems[0] = *puVar15;
                puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
                pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
              }
              local_8a0.m_backend.exp = *(int *)(puVar10 + -1);
              local_8a0.m_backend.neg = *(bool *)((long)puVar10 + -4);
              local_8a0.m_backend._120_8_ = *puVar10;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_5b0,0,(type *)0x0);
              epsilon(&local_630,this);
              bVar5 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (&local_8a0,
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_5b0,&local_630);
              if (bVar5) {
                DIdxSet::addIdx((DIdxSet *)&old_verbosity,(int)lVar12);
              }
            }
          }
          else if (iVar2 == iVar18) {
            SPxColId::SPxColId((SPxColId *)&continuousvars,&polishId);
            iVar8 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                    ::number(this_00,(DataKey *)&continuousvars);
            if ((this->integerVariables).data[iVar8] != 1) {
              iVar8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::number(&this->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ,&polishId);
              ppSVar13 = ppSVar1;
              goto LAB_003daf9c;
            }
          }
          lVar11 = lVar11 + 0x10;
        }
        bVar5 = false;
        while (!bVar5) {
          uVar19 = (ulong)local_ab8;
          iVar18 = 0;
          while ((0 < (int)uVar19 && (!bVar5))) {
            bVar6 = leave(this,local_ab0[uVar19 - 1],true);
            (*(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x88])(this);
            if (bVar6) {
              iVar18 = iVar18 + 1;
              lVar11 = (long)(int)local_ab8;
              local_ab8 = local_ab8 - 1;
              local_ab0[uVar19 - 1] = local_ab0[lVar11 + -1];
              if ((-1 < this->maxIters) &&
                 (this->maxIters <=
                  (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).iterCount)) {
                bVar5 = true;
              }
            }
            bVar6 = isTimeLimitReached(this,false);
            if (bVar6) {
              bVar5 = true;
            }
            uVar19 = uVar19 - 1;
          }
          if (iVar18 == 0) {
            bVar5 = true;
          }
          this->polishCount = this->polishCount + iVar18;
        }
      }
      else {
        lVar11 = 0xf;
        DIdxSet::DIdxSet((DIdxSet *)&old_verbosity,(this->thecovectors->set).thenum);
        for (lVar12 = 0; lVar12 < (this->thecovectors->set).thenum; lVar12 = lVar12 + 1) {
          polishId.super_DataKey =
               (this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).theBaseId.data[lVar12].super_DataKey;
          if (-1 < polishId.super_DataKey.info) {
            if (iVar2 == iVar18) {
              SPxColId::SPxColId((SPxColId *)&continuousvars,&polishId);
              iVar8 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
                      ::number(this_00,(DataKey *)&continuousvars);
              if ((this->integerVariables).data[iVar8] == 0) goto LAB_003db285;
            }
            if (((*ppSVar1)[lVar12] & (P_ON_LOWER|D_FREE)) == P_ON_LOWER) {
              puVar10 = (undefined8 *)
                        ((((this->theFvec->
                           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                        lVar11 * 2);
              puVar15 = (uint *)(puVar10 + -0xf);
              pnVar16 = &local_920;
              for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
                (pnVar16->m_backend).data._M_elems[0] = *puVar15;
                puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
                pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
              }
              local_920.m_backend.exp = *(int *)(puVar10 + -1);
              local_920.m_backend.neg = *(bool *)((long)puVar10 + -4);
              local_920.m_backend._120_8_ = *puVar10;
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>(&local_6b0,0,(type *)0x0);
              epsilon(&local_730,this);
              bVar5 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                (&local_920,
                                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_6b0,&local_730);
              if (bVar5) {
                DIdxSet::addIdx((DIdxSet *)&old_verbosity,(int)lVar12);
              }
            }
          }
LAB_003db285:
          lVar11 = lVar11 + 0x10;
        }
        bVar5 = false;
        while (!bVar5) {
          uVar19 = (ulong)local_ab8;
          iVar18 = 0;
          while ((0 < (int)uVar19 && (!bVar5))) {
            bVar6 = leave(this,local_ab0[uVar19 - 1],true);
            (*(this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x88])(this);
            if (bVar6) {
              iVar18 = iVar18 + 1;
              lVar11 = (long)(int)local_ab8;
              local_ab8 = local_ab8 - 1;
              local_ab0[uVar19 - 1] = local_ab0[lVar11 + -1];
              if ((-1 < this->maxIters) &&
                 (this->maxIters <=
                  (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).iterCount)) {
                bVar5 = true;
              }
            }
            bVar6 = isTimeLimitReached(this,false);
            if (bVar6) {
              bVar5 = true;
            }
            uVar19 = uVar19 - 1;
          }
          if (iVar18 == 0) {
            bVar5 = true;
          }
          this->polishCount = this->polishCount + iVar18;
        }
      }
    }
    DIdxSet::~DIdxSet((DIdxSet *)&old_verbosity);
    pSVar9 = this->spxout;
    if ((pSVar9 != (SPxOut *)0x0) && (2 < (int)pSVar9->m_verbosity)) {
      continuousvars.super_IdxSet._vptr_IdxSet._0_4_ = 3;
      old_verbosity = pSVar9->m_verbosity;
      (*pSVar9->_vptr_SPxOut[2])();
      pSVar9 = soplex::operator<<(this->spxout," --- finished solution polishing (");
      pSVar9 = soplex::operator<<(pSVar9,this->polishCount);
      pSVar9 = soplex::operator<<(pSVar9," pivots)");
      std::endl<char,std::char_traits<char>>(pSVar9->m_streams[pSVar9->m_verbosity]);
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&old_verbosity);
    }
    if ((this->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thestatus != OPTIMAL) {
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thestatus = OPTIMAL;
    }
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x5e])(&local_330,this);
    lVar11 = 0x1c;
    pnVar16 = &origval;
    pnVar17 = &local_3b0;
    for (lVar12 = lVar11; lVar12 != 0; lVar12 = lVar12 + -1) {
      (pnVar17->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
      pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar17 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_3b0.m_backend.exp = origval.m_backend.exp;
    local_3b0.m_backend.neg = origval.m_backend.neg;
    local_3b0.m_backend.fpclass = origval.m_backend.fpclass;
    local_3b0.m_backend.prec_elem = origval.m_backend.prec_elem;
    puVar15 = local_7a0;
    pnVar16 = &local_430;
    for (; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pnVar16->m_backend).data._M_elems[0] = *puVar15;
      puVar15 = puVar15 + (ulong)bVar22 * -2 + 1;
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
    }
    local_430.m_backend.exp = local_aec;
    local_430.m_backend.neg = (bool)local_b01;
    local_430.m_backend.fpclass = local_a38;
    local_430.m_backend.prec_elem = iStack_a34;
    bVar5 = EQrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_330,&local_3b0,&local_430);
    bVar5 = !bVar5;
  }
  return bVar5;
}

Assistant:

bool SPxSolverBase<R>::performSolutionPolishing()
{
   // catch rare case that the iteration limit is exactly reached at optimality
   bool stop = (maxIters >= 0 && iterations() >= maxIters && !isTimeLimitReached());

   // only polish an already optimal basis
   if(stop || polishObj == POLISH_OFF || status() != OPTIMAL)
      return false;

   int nSuccessfulPivots;
   const typename SPxBasisBase<R>::Desc& ds = this->desc();
   const typename SPxBasisBase<R>::Desc::Status* rowstatus = ds.rowStatus();
   const typename SPxBasisBase<R>::Desc::Status* colstatus = ds.colStatus();
   typename SPxBasisBase<R>::Desc::Status stat;
   SPxId polishId;
   bool success = false;

   R alloweddeviation;
   R origval = value();

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- perform solution polishing" << std::endl;)

   if(rep() == COLUMN)
   {
      setType(ENTER); // use primal simplex to preserve feasibility
      init();
      alloweddeviation = entertol();

      instableEnter = false;
      theratiotester->setType(type());

      int nrows = this->nRows();
      int ncols = this->nCols();

      assert(nrows >= 0);
      assert(ncols >= 0);

      if(polishObj == POLISH_INTEGRALITY)
      {
         DIdxSet slackcandidates(nrows);
         DIdxSet continuousvars(ncols);

         // collect nonbasic slack variables that could be made basic
         for(int i = 0; i < nrows; ++i)
         {
            // only check nonbasic rows, skip equations
            if(rowstatus[i] ==  SPxBasisBase<R>::Desc::P_ON_LOWER
                  || rowstatus[i] == SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               // only consider rows with zero dual multiplier to preserve optimality
               if(EQrel((*theCoPvec)[i], (R) 0, this->epsilon()))
                  slackcandidates.addIdx(i);
            }
         }

         // collect continuous variables that could be made basic
         if(integerVariables.size() == ncols)
         {
            for(int i = 0; i < ncols; ++i)
            {
               // skip fixed variables
               if(colstatus[i] == SPxBasisBase<R>::Desc::P_ON_LOWER
                     || colstatus[i] ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
               {
                  // only consider continuous variables with zero dual multiplier to preserve optimality
                  if(EQrel(this->maxObj(i) - (*thePvec)[i], (R) 0, this->epsilon()) && integerVariables[i] == 0)
                     continuousvars.addIdx(i);
               }
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            // identify nonbasic slack variables, i.e. rows, that may be moved into the basis
            for(int i = slackcandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               polishId = coId(slackcandidates.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, rowstatus[slackcandidates.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  slackcandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // identify nonbasic variables that may be moved into the basis
            for(int i = continuousvars.size() - 1; i >= 0 && !stop; --i)
            {
               polishId = id(continuousvars.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, colstatus[continuousvars.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  continuousvars.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
      else
      {
         assert(polishObj == POLISH_FRACTIONALITY);
         assert(dim() >= 0);
         DIdxSet candidates(dim());

         // identify nonbasic variables, i.e. columns, that may be moved into the basis
         for(int i = 0; i < this->nCols() && !stop; ++i)
         {
            if(colstatus[i] == SPxBasisBase<R>::Desc::P_ON_LOWER
                  || colstatus[i] == SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               // only consider variables with zero reduced costs to preserve optimality
               if(EQrel(this->maxObj(i) - (*thePvec)[i], (R) 0, this->epsilon()))
                  candidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = candidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               polishId = id(candidates.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, colstatus[candidates.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  candidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
   }
   else
   {
      setType(LEAVE); // use primal simplex to preserve feasibility
      init();
      alloweddeviation = leavetol();
      instableLeave = false;
      theratiotester->setType(type());
      bool useIntegrality = false;
      int ncols = this->nCols();

      if(integerVariables.size() == ncols)
         useIntegrality = true;

      // in ROW rep: pivot slack out of the basis
      if(polishObj == POLISH_INTEGRALITY)
      {
         assert(dim() >= 0);
         DIdxSet basiccandidates(dim());

         // collect basic candidates that may be moved out of the basis
         for(int i = 0; i < dim(); ++i)
         {
            polishId = this->baseId(i);

            if(polishId.isSPxRowId())
               stat = ds.rowStatus(this->number(polishId));
            else
            {
               // skip (integer) variables
               if(!useIntegrality || integerVariables[this->number(SPxColId(polishId))] == 1)
                  continue;

               stat = ds.colStatus(this->number(polishId));
            }

            if(stat == SPxBasisBase<R>::Desc::P_ON_LOWER || stat ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               if(EQrel((*theFvec)[i], (R) 0, this->epsilon()))
                  basiccandidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = basiccandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               SPxOut::debug(this, "try pivoting: {}", this->baseId(basiccandidates.index(i)));
               success = leave(basiccandidates.index(i), true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  basiccandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
      else
      {
         assert(polishObj == POLISH_FRACTIONALITY);
         assert(dim() >= 0);
         DIdxSet basiccandidates(dim());

         // collect basic (integer) variables, that may be moved out of the basis
         for(int i = 0; i < dim(); ++i)
         {
            polishId = this->baseId(i);

            if(polishId.isSPxRowId())
               continue;
            else
            {
               if(useIntegrality && integerVariables[this->number(SPxColId(polishId))] == 0)
                  continue;

               stat = ds.colStatus(i);
            }

            if(stat == SPxBasisBase<R>::Desc::P_ON_LOWER || stat ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               if(EQrel((*theFvec)[i], (R) 0, this->epsilon()))
                  basiccandidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = basiccandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               SPxOut::debug(this, "try pivoting: {}", this->baseId(basiccandidates.index(i)));
               success = leave(basiccandidates.index(i), true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  basiccandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
   }

   SPX_MSG_INFO1((*this->spxout),
                 (*this->spxout) << " --- finished solution polishing (" << polishCount << " pivots)" << std::endl;)

   this->setStatus(SPxBasisBase<R>::OPTIMAL);

   // if the value() changed significantly (due to numerics) reoptimize after polishing
   if(!EQrel(value(), origval, alloweddeviation))
      return true;
   else
      return false;
}